

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O1

MPP_RET hal_jpege_vepu1_start(void *hal,HalEncTask *task)

{
  undefined4 uVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  char *fmt;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_24;
  
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p\n","hal_jpege_vepu1_start",hal);
  }
  hal_jpege_vepu1_set_extra_info(*hal,(JpegeSyntax *)((long)hal + 0x40),0);
  uVar1 = *(undefined4 *)((long)hal + 0x28);
  local_30 = *(undefined8 *)((long)hal + 0x18);
  local_24 = 0;
  local_28 = uVar1;
  MVar2 = mpp_dev_ioctl(*hal,4,&local_30);
  if (MVar2 == MPP_OK) {
    local_40 = *(undefined8 *)((long)hal + 0x18);
    local_34 = 0;
    local_38 = uVar1;
    MVar2 = mpp_dev_ioctl(*hal,5,&local_40);
    if (MVar2 == MPP_OK) {
      MVar3 = mpp_dev_ioctl(*hal,0xf,(void *)0x0);
      MVar2 = MPP_OK;
      if (MVar3 != MPP_OK) {
        _mpp_log_l(2,"hal_jpege_vepu1","send cmd failed %d\n","hal_jpege_vepu1_start",
                   (ulong)(uint)MVar3);
        MVar2 = MVar3;
      }
      goto LAB_0024b054;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_jpege_vepu1",fmt,"hal_jpege_vepu1_start",(ulong)(uint)MVar2);
LAB_0024b054:
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_start",hal);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_jpege_vepu1_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    hal_jpege_vepu1_set_extra_info(ctx->dev, &ctx->syntax, 0);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size;

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_jpege_dbg_func("leave hal %p\n", hal);
    (void)task;
    return ret;
}